

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OfTests.cpp
# Opt level: O0

void __thiscall IsIterableNotOfTests::~IsIterableNotOfTests(IsIterableNotOfTests *this)

{
  IsIterableNotOfTests *this_local;
  
  ~IsIterableNotOfTests(this);
  operator_delete(this);
  return;
}

Assistant:

virtual void Run()
	{
		Then("a vector of type int is iterable of int so false", [&]() {
			AssertThat(ut11::Is::Iterable::Not::Of<int>()(std::vector<int>()), ut11::Is::False);
		});

		Then("an int is not iterable of int so true", [&]() {
			AssertThat(ut11::Is::Iterable::Not::Of<int>()(1), ut11::Is::True);
		});

		Then("a vector of type string not is iterable of int so true", [&]() {
			AssertThat(ut11::Is::Iterable::Not::Of<int>()(std::vector<std::string>()), ut11::Is::True);
		});

		Then("a vector of a child is iterable of base class so false", [&]() {
			AssertThat(ut11::Is::Iterable::Not::Of<BaseClass>()(std::vector<ChildClass>()), ut11::Is::False);
		});

		Then("Is::Iterable::Of<T>() is an operand", []() {
			AssertThat(ut11::detail::IsOperand< decltype(ut11::Is::Iterable::Not::Of<int>()) >::value, ut11::Is::True);
		});

		Then("Is::EqualTo has an error message", []() {
			AssertThat(ut11::Is::Iterable::Not::Of<int>().GetErrorMessage(std::vector<int>()), ut11::Is::Not::EqualTo(""));
		});
	}